

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

int32_t __thiscall
icu_63::Calendar::getActualHelper
          (Calendar *this,UCalendarDateFields field,int32_t startValue,int32_t endValue,
          UErrorCode *status)

{
  UBool UVar1;
  uint uVar2;
  int iVar3;
  int32_t iVar4;
  undefined4 extraout_var;
  int local_44;
  int32_t result;
  Calendar *work;
  int32_t delta;
  UErrorCode *status_local;
  int local_20;
  int32_t endValue_local;
  int32_t startValue_local;
  UCalendarDateFields field_local;
  Calendar *this_local;
  Calendar *this_00;
  
  this_local._4_4_ = startValue;
  if (startValue != endValue) {
    uVar2 = 0xffffffff;
    if (startValue < endValue) {
      uVar2 = 1;
    }
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      iVar3 = (*(this->super_UObject)._vptr_UObject[3])();
      this_00 = (Calendar *)CONCAT44(extraout_var,iVar3);
      if (this_00 == (Calendar *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        complete(this_00,status);
        setLenient(this_00,'\x01');
        (*(this_00->super_UObject)._vptr_UObject[0x1e])
                  (this_00,(ulong)field,(ulong)(uint)(int)((int)uVar2 < 0),status);
        set(this_00,field,startValue);
        iVar4 = get(this_00,field,status);
        local_44 = startValue;
        if ((((iVar4 == startValue) || (field == UCAL_WEEK_OF_MONTH)) || ((int)uVar2 < 1)) &&
           (UVar1 = ::U_FAILURE(*status), local_20 = startValue, UVar1 == '\0')) {
          do {
            iVar3 = uVar2 + local_20;
            (*(this_00->super_UObject)._vptr_UObject[7])(this_00,(ulong)field,(ulong)uVar2,status);
            iVar4 = get(this_00,field,status);
            local_44 = local_20;
            if ((iVar4 != iVar3) || (UVar1 = ::U_FAILURE(*status), UVar1 != '\0')) break;
            local_44 = iVar3;
            local_20 = iVar3;
          } while (iVar3 != endValue);
        }
        if (this_00 != (Calendar *)0x0) {
          (*(this_00->super_UObject)._vptr_UObject[1])();
        }
        this_local._4_4_ = local_44;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int32_t Calendar::getActualHelper(UCalendarDateFields field, int32_t startValue, int32_t endValue, UErrorCode &status) const
{
#if defined (U_DEBUG_CAL)
    fprintf(stderr, "getActualHelper(%d,%d .. %d, %s)\n", field, startValue, endValue, u_errorName(status));
#endif
    if (startValue == endValue) {
        // if we know that the maximum value is always the same, just return it
        return startValue;
    }

    int32_t delta = (endValue > startValue) ? 1 : -1;

    // clone the calendar so we don't mess with the real one, and set it to
    // accept anything for the field values
    if(U_FAILURE(status)) return startValue;
    Calendar *work = clone();
    if(!work) { status = U_MEMORY_ALLOCATION_ERROR; return startValue; }

    // need to resolve time here, otherwise, fields set for actual limit
    // may cause conflict with fields previously set (but not yet resolved).
    work->complete(status);

    work->setLenient(TRUE);
    work->prepareGetActual(field, delta < 0, status);

    // now try each value from the start to the end one by one until
    // we get a value that normalizes to another value.  The last value that
    // normalizes to itself is the actual maximum for the current date
    work->set(field, startValue);

    // prepareGetActual sets the first day of week in the same week with
    // the first day of a month.  Unlike WEEK_OF_YEAR, week number for the
    // week which contains days from both previous and current month is
    // not unique.  For example, last several days in the previous month
    // is week 5, and the rest of week is week 1.
    int32_t result = startValue;
    if ((work->get(field, status) != startValue
         && field != UCAL_WEEK_OF_MONTH && delta > 0 ) || U_FAILURE(status)) {
#if defined (U_DEBUG_CAL)
        fprintf(stderr, "getActualHelper(fld %d) - got  %d (not %d) - %s\n", field, work->get(field,status), startValue, u_errorName(status));
#endif
    } else {
        do {
            startValue += delta;
            work->add(field, delta, status);
            if (work->get(field, status) != startValue || U_FAILURE(status)) {
#if defined (U_DEBUG_CAL)
                fprintf(stderr, "getActualHelper(fld %d) - got  %d (not %d), BREAK - %s\n", field, work->get(field,status), startValue, u_errorName(status));
#endif
                break;
            }
            result = startValue;
        } while (startValue != endValue);
    }
    delete work;
#if defined (U_DEBUG_CAL)
    fprintf(stderr, "getActualHelper(%d) = %d\n", field, result);
#endif
    return result;
}